

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

shared_ptr<HDD> __thiscall
HDD::CreateDisk(HDD *this,string *path,int64_t llTotalBytes_,IDENTIFYDEVICE *pIdentify_,
               bool fOverwrite_)

{
  bool bVar1;
  uint uVar2;
  HDFHDD *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<HDD> sVar5;
  shared_ptr<HDD> local_50 [2];
  undefined1 local_2a;
  byte local_29;
  IDENTIFYDEVICE *pIStack_28;
  bool fOverwrite__local;
  IDENTIFYDEVICE *pIdentify__local;
  int64_t llTotalBytes__local;
  string *path_local;
  shared_ptr<HDD> *hdd;
  
  local_2a = 0;
  local_29 = fOverwrite_;
  pIStack_28 = pIdentify_;
  pIdentify__local = (IDENTIFYDEVICE *)llTotalBytes_;
  llTotalBytes__local = (int64_t)path;
  path_local = (string *)this;
  std::shared_ptr<HDD>::shared_ptr((shared_ptr<HDD> *)this);
  bVar1 = IsHddImage((string *)llTotalBytes__local);
  if (bVar1) {
    this_00 = (HDFHDD *)operator_new(0x298);
    memset(this_00,0,0x298);
    HDFHDD::HDFHDD(this_00);
    std::shared_ptr<HDD>::shared_ptr<HDFHDD,void>(local_50,this_00);
    std::shared_ptr<HDD>::operator=((shared_ptr<HDD> *)this,local_50);
    std::shared_ptr<HDD>::~shared_ptr(local_50);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  _Var4._M_pi = extraout_RDX;
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    uVar2 = (*peVar3->_vptr_HDD[8])
                      (peVar3,llTotalBytes__local,pIdentify__local,pIStack_28,(ulong)(local_29 & 1))
    ;
    _Var4._M_pi = extraout_RDX_00;
    if ((uVar2 & 1) == 0) {
      std::__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2> *)this);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<HDD>)sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HDD> HDD::CreateDisk(const std::string& path, int64_t llTotalBytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_)
{
    std::shared_ptr<HDD> hdd;

    if (IsHddImage(path))
        hdd = std::shared_ptr<HDD>(new HDFHDD());

    if (hdd && !hdd->Create(path, llTotalBytes_, pIdentify_, fOverwrite_))
        hdd.reset();

    return hdd;
}